

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O3

void __thiscall
dlib::
matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
::matrix(matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
         *this,long rows,long cols)

{
  (this->data).nc_ = 0;
  (this->data).data = (rgb_pixel *)0x0;
  (this->data).nr_ = 0;
  (this->data).pool._vptr_memory_manager_stateless_kernel_1 =
       (_func_int **)&PTR__memory_manager_stateless_kernel_1_001fa460;
  row_major_layout::
  layout<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_5>::set_size
            (&this->data,rows,cols);
  return;
}

Assistant:

matrix (
            long rows,
            long cols 
        )  
        {
            DLIB_ASSERT( (NR == 0 || NR == rows) && ( NC == 0 || NC == cols) && 
                    rows >= 0 && cols >= 0, 
                "\tvoid matrix::matrix(rows, cols)"
                << "\n\tYou have supplied conflicting matrix dimensions"
                << "\n\trows: " << rows
                << "\n\tcols: " << cols
                << "\n\tNR:   " << NR 
                << "\n\tNC:   " << NC 
                );
            data.set_size(rows,cols);
        }